

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

char * __thiscall cmMakefile::GetSONameFlag(cmMakefile *this,string *language)

{
  ulong uVar1;
  char *pcVar2;
  allocator local_39;
  undefined1 local_38 [8];
  string name;
  string *language_local;
  cmMakefile *this_local;
  
  name.field_2._8_8_ = language;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"CMAKE_SHARED_LIBRARY_SONAME",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)local_38,"_");
    std::__cxx11::string::operator+=((string *)local_38,(string *)name.field_2._8_8_);
  }
  std::__cxx11::string::operator+=((string *)local_38,"_FLAG");
  pcVar2 = GetDefinition(this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return pcVar2;
}

Assistant:

const char* cmMakefile::GetSONameFlag(const std::string& language) const
{
  std::string name = "CMAKE_SHARED_LIBRARY_SONAME";
  if (!language.empty()) {
    name += "_";
    name += language;
  }
  name += "_FLAG";
  return GetDefinition(name);
}